

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O1

HelicsTime helicsFederateGetTimeProperty(HelicsFederate fed,int timeProperty,HelicsError *err)

{
  int iVar1;
  Federate *pFVar2;
  int extraout_var;
  long lVar4;
  HelicsTime HVar5;
  long lVar3;
  
  pFVar2 = getFed(fed,err);
  if (pFVar2 == (Federate *)0x0) {
    HVar5 = -1.785e+39;
  }
  else {
    iVar1 = (*pFVar2->_vptr_Federate[7])(pFVar2,timeProperty);
    lVar3 = CONCAT44(extraout_var,iVar1);
    if (lVar3 == 0x7fffffffffffffff) {
      HVar5 = 9223372036.854774;
    }
    else {
      lVar4 = (lVar3 / 1000000000 + ((long)extraout_var >> 0x1f)) - ((long)extraout_var >> 0x1f);
      HVar5 = (double)(lVar3 + lVar4 * -1000000000) * 1e-09 + (double)lVar4;
    }
  }
  return HVar5;
}

Assistant:

HelicsTime helicsFederateGetTimeProperty(HelicsFederate fed, int timeProperty, HelicsError* err)
{
    auto* fedObj = getFed(fed, err);
    if (fedObj == nullptr) {
        return HELICS_TIME_INVALID;
    }
    try {
        auto timeprop = fedObj->getTimeProperty(timeProperty);

        return (timeprop < helics::Time::maxVal()) ? static_cast<double>(timeprop) : HELICS_TIME_MAXTIME;
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
        return HELICS_TIME_INVALID;
    }
    // LCOV_EXCL_STOP
}